

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_utils.h
# Opt level: O3

void release_scaled_references(AV1_COMP *cpi)

{
  bool bVar1;
  int *piVar2;
  RefCntBuffer *pRVar3;
  byte bVar4;
  long lVar5;
  byte bVar6;
  bool bVar7;
  
  bVar1 = (cpi->refresh_frame).golden_frame;
  bVar4 = 1;
  lVar5 = 0x85a7;
  do {
    piVar2 = *(int **)((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) + lVar5 * 8);
    if (lVar5 == 0x85aa) {
      if ((((((cpi->oxcf).pass == AOM_RC_ONE_PASS) && (cpi->ppi->lap_enabled == 0)) &&
           ((cpi->oxcf).mode == '\x01')) &&
          (((cpi->oxcf).gf_cfg.lag_in_frames == 0 && (cpi->ppi->use_svc == 0)))) &&
         (piVar2 != (int *)0x0)) {
        pRVar3 = (cpi->common).ref_frame_map[(cpi->common).remapped_ref_idx[3]];
        if (piVar2[0x13c] == (pRVar3->buf).field_2.field_0.y_crop_width) {
          bVar7 = piVar2[0x13e] == (pRVar3->buf).field_3.field_0.y_crop_height;
        }
        else {
          bVar7 = false;
        }
        bVar6 = 1;
        if ((bVar1 != false) || (bVar7)) goto LAB_001c250c;
        bVar4 = 0;
      }
      else {
        bVar6 = 1;
        if ((bool)(~bVar4 & 1 | piVar2 == (int *)0x0)) {
          bVar4 = piVar2 == (int *)0x0 & bVar4;
        }
        else {
LAB_001c250c:
          *piVar2 = *piVar2 + -1;
          *(undefined8 *)((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) + lVar5 * 8) =
               0;
          bVar4 = bVar6;
        }
      }
    }
    else {
      bVar6 = bVar4;
      if (piVar2 != (int *)0x0) goto LAB_001c250c;
    }
    lVar5 = lVar5 + 1;
    if (lVar5 == 0x85ae) {
      return;
    }
  } while( true );
}

Assistant:

static inline void release_scaled_references(AV1_COMP *cpi) {
  // Scaled references should only need to be released under certain conditions:
  // if the reference will be updated, or if the scaled reference has same
  // resolution. For now only apply this to Golden for non-svc RTC mode.
  AV1_COMMON *const cm = &cpi->common;
  const bool refresh_golden = (cpi->refresh_frame.golden_frame) ? 1 : 0;
  bool release_golden = true;
  for (int i = 0; i < INTER_REFS_PER_FRAME; ++i) {
    RefCntBuffer *const buf = cpi->scaled_ref_buf[i];
    const int golden_ref = (i == GOLDEN_FRAME - 1);
    if (golden_ref && is_one_pass_rt_params(cpi) && !cpi->ppi->use_svc &&
        buf != NULL) {
      const RefCntBuffer *const ref = get_ref_frame_buf(cm, GOLDEN_FRAME);
      const bool same_resoln = buf->buf.y_crop_width == ref->buf.y_crop_width &&
                               buf->buf.y_crop_height == ref->buf.y_crop_height;
      release_golden = refresh_golden || same_resoln;
    }
    if (buf != NULL && (!golden_ref || (golden_ref && release_golden))) {
      --buf->ref_count;
      cpi->scaled_ref_buf[i] = NULL;
    }
  }
}